

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::Throw_ID_NotFound(AMFImporter *this,string *pID)

{
  DeadlyImportError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *pID_local;
  AMFImporter *this_local;
  
  local_18 = pID;
  pID_local = (string *)this;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_58,"Not found node with name \"",local_18);
  std::operator+(&local_38,&local_58,"\".");
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void AMFImporter::Throw_ID_NotFound(const std::string& pID) const
{
	throw DeadlyImportError("Not found node with name \"" + pID + "\".");
}